

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int ret;
  
  uVar1 = test_regex_catchall();
  uVar2 = test_regex_catchall_empty();
  uVar3 = test_regex_exact_match();
  uVar4 = test_regex_no_match();
  uVar5 = test_regex_or_exact();
  uVar6 = test_regex_or_first();
  uVar7 = test_regex_or_second();
  uVar8 = test_regex_or_substring();
  uVar9 = test_regex_or_superstring();
  uVar10 = test_regex_or_superstring_exact();
  return uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int main(void)
{
	int ret = 0;

	ret |= test_regex_catchall();
	ret |= test_regex_catchall_empty();
	ret |= test_regex_exact_match();
	ret |= test_regex_no_match();
	ret |= test_regex_or_exact();
	ret |= test_regex_or_first();
	ret |= test_regex_or_second();
	ret |= test_regex_or_substring();
	ret |= test_regex_or_superstring();
	ret |= test_regex_or_superstring_exact();

	return ret;
}